

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall
nv::FloatImage::applyKernelHorizontal
          (FloatImage *this,PolyphaseKernel *k,int y,uint c,uint a,WrapMode wm,float *output)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float w;
  int idx;
  int j;
  float sum;
  float norm;
  int right;
  int left;
  float center;
  uint i;
  float *alpha;
  float *channel;
  int windowSize;
  float width;
  float iscale;
  float scale;
  uint length;
  WrapMode wm_local;
  uint a_local;
  uint c_local;
  int y_local;
  PolyphaseKernel *k_local;
  FloatImage *this_local;
  
  uVar2 = PolyphaseKernel::length(k);
  uVar1 = this->m_width;
  fVar7 = PolyphaseKernel::width(k);
  iVar3 = PolyphaseKernel::windowSize(k);
  pfVar4 = FloatImage::channel(this,c);
  pfVar5 = FloatImage::channel(this,a);
  for (left = 0; (uint)left < uVar2; left = left + 1) {
    fVar8 = ((float)(uint)left + 0.5) * (1.0 / ((float)uVar2 / (float)uVar1));
    fVar9 = floorf(fVar8 - fVar7);
    ceilf(fVar8 + fVar7);
    j = 0;
    idx = 0;
    for (w = 0.0; (int)w < iVar3; w = (float)((int)w + 1)) {
      pcVar6 = index(this,(char *)(ulong)(uint)((int)fVar9 + (int)w),y);
      fVar8 = PolyphaseKernel::valueAt(k,left,(uint)w);
      fVar8 = fVar8 * (pfVar5[(int)pcVar6] + 0.00390625);
      j = (int)(fVar8 + (float)j);
      idx = (int)(fVar8 * pfVar4[(int)pcVar6] + (float)idx);
    }
    output[(uint)left] = (float)idx / (float)j;
  }
  return;
}

Assistant:

void FloatImage::applyKernelHorizontal(const PolyphaseKernel & k, int y, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_width);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvDebugCheck(right - left <= windowSize);
		
		float norm = 0.0f;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(left + j, y, wm);

			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}